

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

Symbol * slang::ast::InstanceSymbol::createDefaultNested
                   (Scope *scope,ModuleDeclarationSyntax *syntax)

{
  Token *this;
  Compilation *comp;
  ModuleHeaderSyntax *pMVar1;
  Symbol *pSVar2;
  undefined1 auVar3 [16];
  int iVar4;
  SourceLocation location;
  _Variadic_union<const_slang::syntax::SyntaxNode_*> _Var5;
  undefined4 extraout_var;
  HierarchyInstantiationSyntax *syntax_00;
  EVP_PKEY_CTX *src;
  InstanceNameSyntax *instName;
  SmallVector<const_slang::ast::Symbol_*,_5UL> results;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> instances;
  InstanceNameSyntax *local_170;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_168;
  undefined8 local_158;
  undefined1 local_150 [40];
  undefined1 local_128 [72];
  undefined1 local_e0 [16];
  bitmask<slang::ast::ASTFlags> local_d0;
  Symbol *pSStack_c8;
  TempVarSymbol *local_c0;
  RandomizeDetails *pRStack_b8;
  AssertionInstanceDetails *local_b0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  comp = scope->compilation;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  pMVar1 = (syntax->header).ptr;
  this = &pMVar1->name;
  location = parsing::Token::location(this);
  local_168 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)ZEXT816(0);
  local_170 = BumpAllocator::
              emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,std::span<slang::syntax::VariableDimensionSyntax*,18446744073709551615ul>>
                        (&comp->super_BumpAllocator,this,
                         (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                         &local_168._M_first);
  local_168._M_first._M_storage =
       (_Uninitialized<slang::parsing::Token,_true>)
       parsing::Token::createMissing(&comp->super_BumpAllocator,OpenParenthesis,location);
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = 0;
  local_e0 = (undefined1  [16])
             parsing::Token::createMissing(&comp->super_BumpAllocator,CloseParenthesis,location);
  _Var5 = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
          BumpAllocator::
          emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
                    (&comp->super_BumpAllocator,&local_170,&local_168._M_first._M_storage,
                     (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)local_128,
                     (Token *)local_e0);
  local_158 = CONCAT71(local_158._1_7_,1);
  local_168._M_rest = _Var5;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
            (local_a8,(TokenOrSyntax *)&local_168._M_first);
  local_168 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)ZEXT816(0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_e0._8_8_;
  local_e0 = auVar3 << 0x40;
  iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_a8,(EVP_PKEY_CTX *)comp,src);
  local_128._0_8_ = CONCAT44(extraout_var,iVar4);
  syntax_00 = BumpAllocator::
              emplace<slang::syntax::HierarchyInstantiationSyntax,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token&,decltype(nullptr),std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                        (&comp->super_BumpAllocator,
                         (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                         &local_168._M_first,this,(void **)local_e0,
                         (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)local_128,
                         &pMVar1->semi);
  local_e0._8_4_ = 0xffffffff;
  local_e0._0_8_ = scope;
  local_d0.m_bits = 0;
  pSStack_c8 = (Symbol *)0x0;
  local_c0 = (TempVarSymbol *)0x0;
  pRStack_b8 = (RandomizeDetails *)0x0;
  local_b0 = (AssertionInstanceDetails *)0x0;
  local_168._M_first._M_storage.info = (Info *)0x0;
  local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_150;
  local_158 = 5;
  local_128._8_8_ = 0;
  local_128._16_8_ = 5;
  local_128._0_8_ = (pointer)(local_128 + 0x18);
  fromSyntax(comp,syntax_00,(ASTContext *)local_e0,
             (SmallVectorBase<const_slang::ast::Symbol_*> *)&local_168._M_first,
             (SmallVectorBase<const_slang::ast::Symbol_*> *)local_128,(BindDirectiveInfo *)0x0,
             (SyntaxNode *)syntax);
  pSVar2 = *(Symbol **)local_168._M_rest;
  if (pSVar2->kind == Instance) {
    pSVar2->originatingSyntax = (SyntaxNode *)syntax;
  }
  if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x18)) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_150) {
    operator_delete((void *)local_168._M_rest);
  }
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pSVar2;
}

Assistant:

Symbol& InstanceSymbol::createDefaultNested(const Scope& scope,
                                            const ModuleDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto missing = [&](TokenKind tk, SourceLocation loc) {
        return Token::createMissing(comp, tk, loc);
    };

    // Fabricate a fake instantiation syntax to let us reuse all of the real logic
    // with this nested module case as well.
    SmallVector<TokenOrSyntax, 4> instances;
    auto& header = *syntax.header;
    auto loc = header.name.location();
    auto instName = comp.emplace<InstanceNameSyntax>(header.name,
                                                     std::span<VariableDimensionSyntax*>());
    auto instance = comp.emplace<HierarchicalInstanceSyntax>(
        instName, missing(TokenKind::OpenParenthesis, loc), std::span<TokenOrSyntax>(),
        missing(TokenKind::CloseParenthesis, loc));

    instances.push_back(instance);

    auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
        std::span<AttributeInstanceSyntax*>(), header.name, nullptr, instances.copy(comp),
        header.semi);

    ASTContext context(scope, LookupLocation::max);
    SmallVector<const Symbol*> results;
    SmallVector<const Symbol*> implicitNets;
    fromSyntax(comp, *instantiation, context, results, implicitNets, nullptr, &syntax);
    SLANG_ASSERT(implicitNets.empty());
    SLANG_ASSERT(results.size() == 1);

    // We just created this symbol; it's safe to const cast it here.
    auto& result = const_cast<Symbol&>(*results[0]);

    // Swap the syntax back to our original definition syntax
    // so that it's findable in bind directives via the original
    // syntax and not one we just made up.
    if (result.kind == SymbolKind::Instance)
        result.setSyntax(syntax);
    return result;
}